

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestDyndepExplicitInput::RegisterParserTestDyndepExplicitInput
          (RegisterParserTestDyndepExplicitInput *this)

{
  RegisterParserTestDyndepExplicitInput *this_local;
  
  RegisterTest(ParserTestDyndepExplicitInput::Create,"ParserTest.DyndepExplicitInput");
  return;
}

Assistant:

TEST_F(ParserTest, DyndepExplicitInput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build result: cat in\n"
"  dyndep = in\n"));
  Edge* edge = state.GetNode("result", 0)->in_edge();
  ASSERT_TRUE(edge->dyndep_);
  EXPECT_TRUE(edge->dyndep_->dyndep_pending());
  EXPECT_EQ(edge->dyndep_->path(), "in");
}